

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_argv.cpp
# Opt level: O3

void __thiscall DArgs::RemoveArgs(DArgs *this,char *check)

{
  char cVar1;
  uint uVar2;
  FString *pFVar3;
  int iVar4;
  uint index;
  ulong uVar5;
  
  uVar2 = (this->Argv).Count;
  if ((ulong)uVar2 < 2) {
    return;
  }
  pFVar3 = (this->Argv).Array;
  uVar5 = 1;
  while (iVar4 = strcasecmp(check,pFVar3[uVar5].Chars), iVar4 != 0) {
    uVar5 = uVar5 + 1;
    if (uVar2 == uVar5) {
      return;
    }
  }
  index = (uint)uVar5;
  if ((int)index < 1) {
    return;
  }
  if ((int)(uVar2 - 1) <= (int)index) {
    return;
  }
  while( true ) {
    TArray<FString,_FString>::Delete(&this->Argv,index);
    cVar1 = *(this->Argv).Array[index & 0x7fffffff].Chars;
    if (cVar1 == '+') {
      return;
    }
    if (cVar1 == '-') break;
    if ((int)((this->Argv).Count - 1) <= (int)index) {
      return;
    }
  }
  return;
}

Assistant:

void DArgs::RemoveArgs(const char *check)
{
	int i = CheckParm(check);

	if (i > 0 && i < (int)Argv.Size() - 1)
	{
		do 
		{
			RemoveArg(i);
		}
		while (Argv[i][0] != '+' && Argv[i][0] != '-' && i < (int)Argv.Size() - 1);
	}
}